

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void rhash_sha1_process_block(uint *hash,uint *block)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint auStack_1b8 [8];
  uint auStack_198 [5];
  uint auStack_184 [85];
  
  lVar1 = 0;
  do {
    uVar2 = block[lVar1];
    auStack_184[lVar1 + 3] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0x10;
  do {
    uVar2 = auStack_198[lVar1] ^ auStack_184[lVar1] ^ auStack_1b8[lVar1 + 2] ^ auStack_1b8[lVar1];
    auStack_184[lVar1 + 3] = uVar2 << 1 | (uint)((int)uVar2 < 0);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x50);
  lVar1 = 0;
  uVar2 = hash[4];
  uVar9 = hash[3];
  uVar6 = hash[2];
  uVar8 = hash[1];
  uVar7 = *hash;
  do {
    uVar3 = uVar7;
    uVar5 = uVar6;
    uVar4 = uVar9;
    uVar7 = ((uVar4 ^ uVar5) & uVar8 ^ uVar4) + (uVar3 << 5 | uVar3 >> 0x1b) + uVar2 +
            auStack_184[lVar1 + 3] + 0x5a827999;
    uVar6 = uVar8 << 0x1e | uVar8 >> 2;
    lVar1 = lVar1 + 1;
    uVar2 = uVar4;
    uVar9 = uVar5;
    uVar8 = uVar3;
  } while (lVar1 != 0x14);
  lVar1 = 0x14;
  do {
    uVar9 = uVar5;
    uVar2 = uVar7;
    uVar5 = uVar6;
    uVar7 = (uVar5 ^ uVar3 ^ uVar9) + (uVar2 << 5 | uVar2 >> 0x1b) + uVar4 + auStack_184[lVar1 + 3]
            + 0x6ed9eba1;
    uVar6 = uVar3 << 0x1e | uVar3 >> 2;
    lVar1 = lVar1 + 1;
    uVar3 = uVar2;
    uVar4 = uVar9;
  } while (lVar1 != 0x28);
  lVar1 = 0x28;
  do {
    uVar3 = uVar5;
    uVar8 = uVar7;
    uVar5 = uVar6;
    uVar7 = auStack_184[lVar1 + 3] +
            (uVar3 & uVar5 | (uVar3 | uVar5) & uVar2) + (uVar8 << 5 | uVar8 >> 0x1b) + uVar9 +
            0x8f1bbcdc;
    uVar6 = uVar2 << 0x1e | uVar2 >> 2;
    lVar1 = lVar1 + 1;
    uVar2 = uVar8;
    uVar9 = uVar3;
  } while (lVar1 != 0x3c);
  lVar1 = 0x3c;
  do {
    uVar9 = uVar5;
    uVar2 = uVar7;
    uVar5 = uVar6;
    uVar7 = (uVar5 ^ uVar8 ^ uVar9) + (uVar2 << 5 | uVar2 >> 0x1b) + uVar3 + auStack_184[lVar1 + 3]
            + 0xca62c1d6;
    uVar6 = uVar8 << 0x1e | uVar8 >> 2;
    lVar1 = lVar1 + 1;
    uVar8 = uVar2;
    uVar3 = uVar9;
  } while (lVar1 != 0x50);
  *hash = uVar7 + *hash;
  hash[1] = uVar2 + hash[1];
  hash[2] = uVar6 + hash[2];
  hash[3] = uVar5 + hash[3];
  hash[4] = uVar9 + hash[4];
  return;
}

Assistant:

static void rhash_sha1_process_block(unsigned* hash, const unsigned* block)
{
	int           t;                 /* Loop counter */
	uint32_t      temp;              /* Temporary word value */
	uint32_t      W[80];             /* Word sequence */
	uint32_t      A, B, C, D, E;     /* Word buffers */

	/* initialize the first 16 words in the array W */
	for (t = 0; t < 16; t++) {
		/* note: it is much faster to apply be2me here, then using be32_copy */
		W[t] = be2me_32(block[t]);
	}

	/* initialize the rest */
	for (t = 16; t < 80; t++) {
		W[t] = ROTL32(W[t - 3] ^ W[t - 8] ^ W[t - 14] ^ W[t - 16], 1);
	}

	A = hash[0];
	B = hash[1];
	C = hash[2];
	D = hash[3];
	E = hash[4];

	for (t = 0; t < 20; t++) {
		/* the following is faster than ((B & C) | ((~B) & D)) */
		temp =  ROTL32(A, 5) + (((C ^ D) & B) ^ D)
			+ E + W[t] + 0x5A827999;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 20; t < 40; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0x6ED9EBA1;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 40; t < 60; t++) {
		temp = ROTL32(A, 5) + ((B & C) | (B & D) | (C & D))
			+ E + W[t] + 0x8F1BBCDC;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	for (t = 60; t < 80; t++) {
		temp = ROTL32(A, 5) + (B ^ C ^ D) + E + W[t] + 0xCA62C1D6;
		E = D;
		D = C;
		C = ROTL32(B, 30);
		B = A;
		A = temp;
	}

	hash[0] += A;
	hash[1] += B;
	hash[2] += C;
	hash[3] += D;
	hash[4] += E;
}